

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double __thiscall gulps::log(gulps *this,double __x)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  message *in_RSI;
  double __x_00;
  double extraout_XMM0_Qa;
  unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> *out;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
  *__range1;
  message msg;
  message *in_msg_local;
  gulps *this_local;
  
  message::message((message *)&__range1,in_RSI);
  __end1 = std::__cxx11::
           list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
           ::begin(&this->outputs);
  out = (unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> *)
        std::__cxx11::
        list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
        ::end(&this->outputs);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&out);
    if (!bVar1) break;
    this_00 = std::
              _List_iterator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>
              ::operator*(&__end1);
    this_01 = std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::
              operator->(this_00);
    gulps_output::log(this_01,__x_00);
    std::
    _List_iterator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>
    ::operator++(&__end1);
  }
  message::~message((message *)&__range1);
  return extraout_XMM0_Qa;
}

Assistant:

void log(message&& in_msg)
	{
		message msg = std::move(in_msg);
		
		for(std::unique_ptr<gulps_output>& out : outputs)
			out->log(msg);
	}